

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-ui-imgui.cc
# Opt level: O0

void __thiscall HostUI::render_draw_lists(HostUI *this,ImDrawData *draw_data)

{
  ImDrawList *this_00;
  int iVar1;
  ImGuiIO *pIVar2;
  ImDrawCmd *pIVar3;
  ImDrawCmd *cmd;
  long lStack_40;
  int i;
  ImDrawIdx *idx_buffer_offset;
  ImDrawList *cmd_list;
  int n;
  int fb_height;
  int fb_width;
  ImGuiIO *io;
  ImDrawData *draw_data_local;
  HostUI *this_local;
  
  pIVar2 = ImGui::GetIO();
  iVar1 = (int)((pIVar2->DisplaySize).y * (pIVar2->DisplayFramebufferScale).y);
  if (((int)((pIVar2->DisplaySize).x * (pIVar2->DisplayFramebufferScale).x) != 0) && (iVar1 != 0)) {
    ImDrawData::ScaleClipRects(draw_data,&pIVar2->DisplayFramebufferScale);
    glEnable(0xbe2);
    glBlendFunc(0x302,0x303);
    glDisable(0xb44);
    glDisable(0xb71);
    glEnable(0xc11);
    (*glUseProgram)(this->program);
    (*glUniform1i)(this->uSampler,0);
    (*glUniformMatrix3fv)(this->uProjMatrix,1,'\0',(GLfloat *)this->proj_matrix);
    (*glBindVertexArray)(this->vao);
    for (cmd_list._4_4_ = 0; cmd_list._4_4_ < draw_data->CmdListsCount;
        cmd_list._4_4_ = cmd_list._4_4_ + 1) {
      this_00 = draw_data->CmdLists[cmd_list._4_4_];
      lStack_40 = 0;
      (*glBindBuffer)(0x8892,this->vbo);
      (*glBufferData)(0x8892,(long)(this_00->VtxBuffer).Size * 0x14,(this_00->VtxBuffer).Data,0x88e0
                     );
      (*glBindBuffer)(0x8893,this->ebo);
      (*glBufferData)(0x8893,(long)(this_00->IdxBuffer).Size << 1,(this_00->IdxBuffer).Data,0x88e0);
      for (cmd._4_4_ = 0; cmd._4_4_ < (this_00->CmdBuffer).Size; cmd._4_4_ = cmd._4_4_ + 1) {
        pIVar3 = ImVector<ImDrawCmd>::operator[](&this_00->CmdBuffer,cmd._4_4_);
        if (pIVar3->UserCallback == (ImDrawCallback)0x0) {
          glBindTexture(0xde1,(ulong)pIVar3->TextureId & 0xffffffff);
          glScissor((int)(pIVar3->ClipRect).x,(int)((float)iVar1 - (pIVar3->ClipRect).w),
                    (int)((pIVar3->ClipRect).z - (pIVar3->ClipRect).x),
                    (int)((pIVar3->ClipRect).w - (pIVar3->ClipRect).y));
          glDrawElements(4,pIVar3->ElemCount,0x1403,lStack_40);
        }
        else {
          (*pIVar3->UserCallback)(this_00,pIVar3);
        }
        lStack_40 = lStack_40 + (ulong)pIVar3->ElemCount * 2;
      }
    }
    glDisable(0xc11);
    glDisable(0xbe2);
  }
  return;
}

Assistant:

void HostUI::render_draw_lists(ImDrawData* draw_data) {
  ImGuiIO& io = ImGui::GetIO();
  int fb_width = (int)(io.DisplaySize.x * io.DisplayFramebufferScale.x);
  int fb_height = (int)(io.DisplaySize.y * io.DisplayFramebufferScale.y);
  if (fb_width == 0 || fb_height == 0) {
    return;
  }

  draw_data->ScaleClipRects(io.DisplayFramebufferScale);

  glEnable(GL_BLEND);
  glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
  glDisable(GL_CULL_FACE);
  glDisable(GL_DEPTH_TEST);
  glEnable(GL_SCISSOR_TEST);

  glUseProgram(program);
  glUniform1i(uSampler, 0);
  glUniformMatrix3fv(uProjMatrix, 1, GL_FALSE, proj_matrix);
  glBindVertexArray(vao);

  for (int n = 0; n < draw_data->CmdListsCount; n++) {
    const ImDrawList* cmd_list = draw_data->CmdLists[n];
    const ImDrawIdx* idx_buffer_offset = 0;

    glBindBuffer(GL_ARRAY_BUFFER, vbo);
    glBufferData(GL_ARRAY_BUFFER,
                 (GLsizeiptr)cmd_list->VtxBuffer.Size * sizeof(ImDrawVert),
                 (GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW);

    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, ebo);
    glBufferData(GL_ELEMENT_ARRAY_BUFFER,
                 (GLsizeiptr)cmd_list->IdxBuffer.Size * sizeof(ImDrawIdx),
                 (GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW);

    for (int i = 0; i < cmd_list->CmdBuffer.Size; i++) {
      const ImDrawCmd* cmd = &cmd_list->CmdBuffer[i];
      if (cmd->UserCallback) {
        cmd->UserCallback(cmd_list, cmd);
      } else {
        glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)cmd->TextureId);
        glScissor((int)cmd->ClipRect.x, (int)(fb_height - cmd->ClipRect.w),
                  (int)(cmd->ClipRect.z - cmd->ClipRect.x),
                  (int)(cmd->ClipRect.w - cmd->ClipRect.y));
        glDrawElements(
            GL_TRIANGLES, (GLsizei)cmd->ElemCount,
            sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT,
            idx_buffer_offset);
      }
      idx_buffer_offset += cmd->ElemCount;
    }
  }

  glDisable(GL_SCISSOR_TEST);
  glDisable(GL_BLEND);
}